

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pipeline_layout_handle
          (Impl *this,Value *state,VkPipelineLayout *out_layout)

{
  bool bVar1;
  Ch *str;
  pointer ppVar2;
  bool bVar3;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false> local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false> local_38;
  iterator layout_itr;
  uint64_t layout;
  VkPipelineLayout *out_layout_local;
  Value *state_local;
  Impl *this_local;
  
  str = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(state);
  layout_itr.super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false>)
           string_to_uint64(str);
  if (layout_itr.
      super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false>._M_cur
      == (__node_type *)0x0) {
    *out_layout = (VkPipelineLayout)0x0;
  }
  else {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_VkPipelineLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>_>
         ::find(&this->replayed_pipeline_layouts,(key_type *)&layout_itr);
    local_40._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<unsigned_long,VkPipelineLayout_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipelineLayout_T*>>>>
                   (&this->replayed_pipeline_layouts);
    bVar1 = std::__detail::operator==(&local_38,&local_40);
    bVar3 = true;
    if (!bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false,_false>
                           *)&local_38);
      bVar3 = ppVar2->second == (VkPipelineLayout_T *)0x0;
    }
    if (bVar3) {
      log_missing_resource
                ("Pipeline layout",
                 (Hash)layout_itr.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false>
                       ._M_cur);
      return false;
    }
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false,_false>
                         *)&local_38);
    *out_layout = ppVar2->second;
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_pipeline_layout_handle(const Value &state, VkPipelineLayout *out_layout)
{
	auto layout = string_to_uint64(state.GetString());
	if (layout > 0)
	{
		auto layout_itr = replayed_pipeline_layouts.find(layout);
		if (layout_itr == end(replayed_pipeline_layouts) || layout_itr->second == VK_NULL_HANDLE)
		{
			log_missing_resource("Pipeline layout", layout);
			return false;
		}
		else
			*out_layout = layout_itr->second;
	}
	else
		*out_layout = VK_NULL_HANDLE;

	return true;
}